

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O3

QTextEdit * __thiscall QTextEdit::cursorForPosition(QTextEdit *this,QPoint *pos)

{
  long lVar1;
  QPoint QVar2;
  QPointF *pos_00;
  LayoutDirection LVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = pos[1];
  pos_00 = *(QPointF **)((long)QVar2 + 0x2f8);
  LVar3 = QWidget::layoutDirection(*(QWidget **)((long)QVar2 + 8));
  if (LVar3 == RightToLeft) {
    QAbstractSlider::maximum(*(QAbstractSlider **)((long)QVar2 + 0x288));
    QAbstractSlider::value(*(QAbstractSlider **)((long)QVar2 + 0x288));
  }
  else {
    QAbstractSlider::value(*(QAbstractSlider **)((long)QVar2 + 0x288));
  }
  QAbstractSlider::value(*(QAbstractSlider **)((long)QVar2 + 0x290));
  QWidgetTextControl::cursorForPosition((QWidgetTextControl *)this,pos_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextCursor QTextEdit::cursorForPosition(const QPoint &pos) const
{
    Q_D(const QTextEdit);
    return d->control->cursorForPosition(d->mapToContents(pos));
}